

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ImDrawCmd *pIVar8;
  long lVar9;
  ImVec4 *pIVar10;
  ImDrawCmd *__dest;
  int iVar11;
  int iVar12;
  void *pvVar13;
  
  lVar9 = (long)(this->_ClipRectStack).Size;
  pIVar10 = (this->_ClipRectStack).Data + lVar9 + -1;
  if (lVar9 == 0) {
    pIVar10 = &this->_Data->ClipRectFullscreen;
  }
  fVar1 = pIVar10->x;
  fVar2 = pIVar10->z;
  lVar9 = (long)(this->_TextureIdStack).Size;
  if (lVar9 == 0) {
    pvVar13 = (void *)0x0;
  }
  else {
    pvVar13 = (this->_TextureIdStack).Data[lVar9 + -1];
  }
  if (fVar1 <= fVar2) {
    fVar3 = pIVar10->y;
    fVar4 = pIVar10->w;
    if (fVar3 <= fVar4) {
      uVar5 = (this->IdxBuffer).Size;
      uVar6 = this->_VtxCurrentOffset;
      iVar12 = (this->CmdBuffer).Size;
      iVar7 = (this->CmdBuffer).Capacity;
      if (iVar12 == iVar7) {
        iVar12 = iVar12 + 1;
        if (iVar7 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar7 / 2 + iVar7;
        }
        if (iVar12 < iVar11) {
          iVar12 = iVar11;
        }
        if (iVar7 < iVar12) {
          __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar12 * 0x38);
          pIVar8 = (this->CmdBuffer).Data;
          if (pIVar8 != (ImDrawCmd *)0x0) {
            memcpy(__dest,pIVar8,(long)(this->CmdBuffer).Size * 0x38);
            ImGui::MemFree((this->CmdBuffer).Data);
          }
          (this->CmdBuffer).Data = __dest;
          (this->CmdBuffer).Capacity = iVar12;
        }
      }
      pIVar8 = (this->CmdBuffer).Data;
      iVar12 = (this->CmdBuffer).Size;
      pIVar8[iVar12].ElemCount = 0;
      pIVar8[iVar12].ClipRect.x = fVar1;
      pIVar8[iVar12].ClipRect.y = fVar3;
      pIVar8[iVar12].ClipRect.z = fVar2;
      pIVar8[iVar12].ClipRect.w = fVar4;
      pIVar8[iVar12].TextureId = pvVar13;
      pIVar8[iVar12].VtxOffset = uVar6;
      pIVar8[iVar12].IdxOffset = uVar5;
      pIVar8[iVar12].UserCallback = (ImDrawCallback)0x0;
      (&pIVar8[iVar12].UserCallback)[1] = (ImDrawCallback)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui_draw.cpp"
                ,0x1af,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();
    draw_cmd.VtxOffset = _VtxCurrentOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}